

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.cc
# Opt level: O0

longlong __thiscall BitStream::getBitsSigned(BitStream *this,size_t nbits)

{
  unsigned_long_long local_28;
  longlong result;
  unsigned_long_long bits;
  size_t nbits_local;
  BitStream *this_local;
  
  local_28 = read_bits(&this->p,&this->bit_offset,&this->bits_available,nbits);
  if (1L << ((byte)nbits - 1 & 0x3f) < (long)local_28) {
    local_28 = local_28 - (1L << ((byte)nbits & 0x3f));
  }
  return local_28;
}

Assistant:

long long
BitStream::getBitsSigned(size_t nbits)
{
    unsigned long long bits = read_bits(this->p, this->bit_offset, this->bits_available, nbits);
    long long result = 0;
    if (static_cast<long long>(bits) > 1LL << (nbits - 1)) {
        result = static_cast<long long>(bits - (1ULL << nbits));
    } else {
        result = static_cast<long long>(bits);
    }
    return result;
}